

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O0

int __thiscall
muduo::FileUtil::ReadSmallFile::readToString<std::__cxx11::string>
          (ReadSmallFile *this,int maxSize,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content,
          int64_t *fileSize,int64_t *modifyTime,int64_t *createTime)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  unsigned_long uVar4;
  long lVar5;
  unsigned_long *puVar6;
  ssize_t sVar7;
  int *piVar8;
  long *in_RCX;
  char *in_RDX;
  int *in_RDI;
  __time_t *in_R8;
  __time_t *in_R9;
  ssize_t n;
  size_t toRead;
  stat statbuf;
  int err;
  unsigned_long local_e8;
  unsigned_long local_e0;
  size_t local_d8;
  long local_d0;
  stat local_c8;
  int local_34;
  __time_t *local_30;
  __time_t *local_28;
  long *local_20;
  char *local_18;
  int local_c [3];
  
  local_34 = in_RDI[1];
  if (-1 < *in_RDI) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    std::__cxx11::string::clear();
    if (local_20 != (long *)0x0) {
      iVar2 = fstat(*in_RDI,&local_c8);
      pcVar1 = local_18;
      if (iVar2 == 0) {
        if ((local_c8.st_mode & 0xf000) == 0x8000) {
          *local_20 = local_c8.st_size;
          local_d0 = implicit_cast<long,int>(local_c);
          std::min<long>(&local_d0,local_20);
          std::__cxx11::string::reserve((ulong)pcVar1);
        }
        else if ((local_c8.st_mode & 0xf000) == 0x4000) {
          local_34 = 0x15;
        }
        if (local_28 != (__time_t *)0x0) {
          *local_28 = local_c8.st_mtim.tv_sec;
        }
        if (local_30 != (__time_t *)0x0) {
          *local_30 = local_c8.st_ctim.tv_sec;
        }
      }
      else {
        piVar8 = __errno_location();
        local_34 = *piVar8;
      }
    }
    while( true ) {
      uVar3 = std::__cxx11::string::size();
      uVar4 = implicit_cast<unsigned_long,int>(local_c);
      if (uVar4 <= uVar3) break;
      uVar4 = implicit_cast<unsigned_long,int>(local_c);
      lVar5 = std::__cxx11::string::size();
      local_e0 = uVar4 - lVar5;
      local_e8 = 0x10000;
      puVar6 = std::min<unsigned_long>(&local_e0,&local_e8);
      local_d8 = *puVar6;
      sVar7 = read(*in_RDI,in_RDI + 2,local_d8);
      if (sVar7 < 1) {
        if (-1 < sVar7) {
          return local_34;
        }
        piVar8 = __errno_location();
        return *piVar8;
      }
      std::__cxx11::string::append(local_18,(ulong)(in_RDI + 2));
    }
  }
  return local_34;
}

Assistant:

int FileUtil::ReadSmallFile::readToString(int maxSize,
                                          String* content,
                                          int64_t* fileSize,
                                          int64_t* modifyTime,
                                          int64_t* createTime)
{
  static_assert(sizeof(off_t) == 8, "_FILE_OFFSET_BITS = 64");
  assert(content != NULL);
  int err = err_;
  if (fd_ >= 0)  //fd正常打开
  {
    content->clear(); //清空content里面的内容

    if (fileSize)  //文件大小不为0
    {
      struct stat statbuf;
      if (::fstat(fd_, &statbuf) == 0)
      {
        if (S_ISREG(statbuf.st_mode))
        {
          *fileSize = statbuf.st_size;
          content->reserve(static_cast<int>(std::min(implicit_cast<int64_t>(maxSize), *fileSize)));
        }
        else if (S_ISDIR(statbuf.st_mode))
        {
          err = EISDIR;
        }
        if (modifyTime)
        {
          *modifyTime = statbuf.st_mtime;
        }
        if (createTime)
        {
          *createTime = statbuf.st_ctime;
        }
      }//end <<if(fd > 0)>>
      else
      {
        err = errno;
      }
    }

    //如果内容存储区的大小小于最大的大小
    while (content->size() < implicit_cast<size_t>(maxSize))
    {
      size_t toRead = std::min(implicit_cast<size_t>(maxSize) - content->size(), sizeof(buf_));
      ssize_t n = ::read(fd_, buf_, toRead);
      if (n > 0)
      {
        content->append(buf_, n);
      }
      else
      {
        if (n < 0)
        {
          err = errno;
        }
        break;
      }
    }
  }
  return err;
}